

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

bool __thiscall ON_PolyCurve::IsInPlane(ON_PolyCurve *this,ON_Plane *plane,double tolerance)

{
  uint uVar1;
  ON_Curve *pOVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  uVar5 = 0;
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = uVar5;
  }
  bVar3 = false;
  while( true ) {
    if (uVar6 == uVar5) {
      return bVar3;
    }
    pOVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar5];
    if (pOVar2 == (ON_Curve *)0x0) break;
    iVar4 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x33])
                      (tolerance,pOVar2,plane);
    uVar5 = uVar5 + 1;
    bVar3 = true;
    if ((char)iVar4 == '\0') {
      return false;
    }
  }
  return false;
}

Assistant:

bool
ON_PolyCurve::IsInPlane(
      const ON_Plane& plane, // plane to test
      double tolerance // tolerance to use when checking linearity
      ) const
{
  bool rc = false;
  int i, count = Count();
  for ( i = 0; i < count; i++ )
  {
    if ( !m_segment[i] )
      return false;
    rc = m_segment[i]->IsInPlane( plane, tolerance );
    if ( !rc )
      break;
  }
  return rc;
}